

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_posfix(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int line)

{
  anon_union_8_6_45a55102_for_u aVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  expkind eVar5;
  int r2;
  uint uVar6;
  int iVar7;
  Instruction i;
  BinOpr opr_00;
  int *l1;
  OpCode op;
  uint *puVar8;
  bool bVar9;
  OpCode mmop;
  TMS event;
  int local_5c;
  expdesc temp;
  
  luaK_dischargevars(fs,e2);
  if ((opr < OPR_CONCAT) && (iVar3 = constfolding(fs,opr,e1,e2), iVar3 != 0)) {
    return;
  }
  switch(opr) {
  case OPR_ADD:
  case OPR_MUL:
    uVar6 = 0;
    if ((e1->t == e1->f) && (e1->k - VKFLT < 2)) {
      temp.t = e1->t;
      temp.f = e1->f;
      temp.k = e1->k;
      temp._4_4_ = *(undefined4 *)&e1->field_0x4;
      temp.u = e1->u;
      iVar3 = e2->f;
      e1->t = e2->t;
      e1->f = iVar3;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = temp.t;
      e2->f = temp.f;
      e2->k = temp.k;
      *(undefined4 *)&e2->field_0x4 = temp._4_4_;
      e2->u = temp.u;
      uVar6 = 1;
    }
    if (opr != OPR_ADD) goto LAB_0010e5b0;
    if (((e2->k != VKINT) || (e2->t != e2->f)) || ((e2->u).ival - 0x81U < 0xffffffffffffff00)) {
      opr = OPR_ADD;
      goto LAB_0010e5b0;
    }
    iVar3 = (e2->u).info + 0x7f;
    op = OP_ADDI;
    event = TM_ADD;
    break;
  case OPR_SUB:
    iVar3 = finishbinexpneg(fs,e1,e2,OP_ADDI,line,TM_SUB);
    if (iVar3 != 0) {
      return;
    }
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
    uVar6 = 0;
LAB_0010e5b0:
    codearith(fs,opr,e1,e2,uVar6,line);
    return;
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
    bVar9 = e1->k == VKINT;
    if (bVar9) {
      temp.t = e1->t;
      temp.f = e1->f;
      temp.k = e1->k;
      temp._4_4_ = *(undefined4 *)&e1->field_0x4;
      temp.u = e1->u;
      iVar3 = e2->f;
      e1->t = e2->t;
      e1->f = iVar3;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = temp.t;
      e2->f = temp.f;
      e2->k = temp.k;
      *(undefined4 *)&e2->field_0x4 = temp._4_4_;
      e2->u = temp.u;
    }
    uVar6 = (uint)bVar9;
    if ((e2->k != VKINT) || (iVar3 = luaK_exp2K(fs,e2), iVar3 == 0)) {
      codebinNoK(fs,opr,e1,e2,uVar6,line);
      return;
    }
    event = opr + OPR_IDIV;
    iVar3 = (e2->u).info;
    op = opr + (OPR_OR|OPR_MUL);
    mmop = OP_MMBINK;
    goto LAB_0010e7c4;
  case OPR_SHL:
    if (((e1->k != VKINT) || (e1->t != e1->f)) || ((e1->u).ival - 0x81U < 0xffffffffffffff00)) {
      iVar3 = finishbinexpneg(fs,e1,e2,OP_SHRI,line,TM_SHL);
      if (iVar3 != 0) {
        return;
      }
      opr_00 = OPR_SHL;
LAB_0010e533:
      codebinexpval(fs,opr_00,e1,e2,line);
      return;
    }
    temp.t = e1->t;
    temp.f = e1->f;
    temp.k = e1->k;
    temp._4_4_ = *(undefined4 *)&e1->field_0x4;
    temp.u = e1->u;
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
    e2->t = temp.t;
    e2->f = temp.f;
    e2->k = temp.k;
    *(undefined4 *)&e2->field_0x4 = temp._4_4_;
    e2->u = temp.u;
    iVar3 = (e2->u).info + 0x7f;
    op = OP_SHLI;
    uVar6 = 1;
    event = TM_SHL;
    break;
  case OPR_SHR:
    if (((e2->k != VKINT) || (e2->t != e2->f)) || ((e2->u).ival - 0x81U < 0xffffffffffffff00)) {
      opr_00 = OPR_SHR;
      goto LAB_0010e533;
    }
    iVar3 = (e2->u).info + 0x7f;
    op = OP_SHRI;
    uVar6 = 0;
    event = TM_SHR;
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(fs,e2);
    if (fs->lasttarget < fs->pc) {
      puVar8 = fs->f->code + (long)fs->pc + -1;
    }
    else {
      puVar8 = &previousinstruction_invalidinstruction;
    }
    uVar6 = *puVar8;
    if ((uVar6 & 0x7f) == 0x35) {
      if ((e2->k == VNONRELOC) && (iVar3 = (e2->u).info, iVar4 = luaY_nvarstack(fs), iVar4 <= iVar3)
         ) {
        fs->freereg = fs->freereg + 0xff;
      }
      *puVar8 = uVar6 + 0x10000 & 0xff0000 | *puVar8 & 0xff00807f | ((e1->u).info & 0xffU) << 7;
      return;
    }
    luaK_code(fs,(e1->u).info << 7 | 0x20035);
    if ((e2->k == VNONRELOC) && (iVar3 = (e2->u).info, iVar4 = luaY_nvarstack(fs), iVar4 <= iVar3))
    {
      fs->freereg = fs->freereg + 0xff;
    }
    luaK_fixline(fs,line);
    return;
  case OPR_EQ:
  case OPR_NE:
    local_5c = 0;
    if (e1->k != VNONRELOC) {
      temp.t = e1->t;
      temp.f = e1->f;
      temp.k = e1->k;
      temp._4_4_ = *(undefined4 *)&e1->field_0x4;
      temp.u = e1->u;
      iVar3 = e2->f;
      e1->t = e2->t;
      e1->f = iVar3;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = temp.t;
      e2->f = temp.f;
      e2->k = temp.k;
      *(undefined4 *)&e2->field_0x4 = temp._4_4_;
      e2->u = temp.u;
    }
    iVar3 = luaK_exp2anyreg(fs,e1);
    iVar4 = isSCnumber(e2,(int *)&temp,&local_5c);
    if (iVar4 == 0) {
      iVar4 = exp2RK(fs,e2);
      if (iVar4 == 0) {
        eVar5 = luaK_exp2anyreg(fs,e2);
        uVar6 = 0x39;
      }
      else {
        eVar5 = (e2->u).info;
        uVar6 = 0x3c;
      }
    }
    else {
      uVar6 = 0x3d;
      eVar5 = temp.k;
    }
    iVar7 = -1;
    iVar4 = -1;
    if (e1->k == VNONRELOC) {
      iVar4 = (e1->u).info;
    }
    if (e2->k == VNONRELOC) {
      iVar7 = (e2->u).info;
    }
    freeregs(fs,iVar4,iVar7);
    i = (uint)(opr == OPR_EQ) << 0xf | eVar5 << 0x10 | local_5c << 0x18 | uVar6 | iVar3 << 7;
    goto LAB_0010e70a;
  case OPR_LT:
  case OPR_LE:
    goto switchD_0010e1e6_caseD_e;
  case OPR_GT:
  case OPR_GE:
    temp.t = e1->t;
    temp.f = e1->f;
    temp.k = e1->k;
    temp._4_4_ = *(undefined4 *)&e1->field_0x4;
    temp.u = e1->u;
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
    e2->t = temp.t;
    e2->f = temp.f;
    e2->k = temp.k;
    *(undefined4 *)&e2->field_0x4 = temp._4_4_;
    e2->u = temp.u;
    opr = opr - OPR_MOD;
switchD_0010e1e6_caseD_e:
    local_5c = 0;
    iVar3 = isSCnumber(e2,(int *)&temp,&local_5c);
    if (iVar3 == 0) {
      iVar3 = isSCnumber(e1,(int *)&temp,&local_5c);
      if (iVar3 != 0) {
        iVar3 = luaK_exp2anyreg(fs,e2);
        iVar4 = 0x32;
        goto LAB_0010e408;
      }
      iVar3 = luaK_exp2anyreg(fs,e1);
      eVar5 = luaK_exp2anyreg(fs,e2);
      iVar4 = 0x2c;
    }
    else {
      iVar3 = luaK_exp2anyreg(fs,e1);
      iVar4 = 0x30;
LAB_0010e408:
      eVar5 = temp.k;
    }
    r2 = -1;
    iVar7 = -1;
    if (e1->k == VNONRELOC) {
      iVar7 = (e1->u).info;
    }
    if (e2->k == VNONRELOC) {
      r2 = (e2->u).info;
    }
    freeregs(fs,iVar7,r2);
    i = local_5c << 0x18 | eVar5 << 0x10 | iVar3 << 7 | iVar4 + opr | 0x8000;
LAB_0010e70a:
    luaK_code(fs,i);
    iVar3 = luaK_code(fs,0x7fffff38);
    (e1->u).info = iVar3;
    e1->k = VJMP;
    return;
  case OPR_AND:
    l1 = &e2->f;
    iVar3 = e1->f;
    goto LAB_0010e55f;
  case OPR_OR:
    l1 = &e2->t;
    iVar3 = e1->t;
LAB_0010e55f:
    luaK_concat(fs,l1,iVar3);
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
  default:
    goto switchD_0010e1e6_default;
  }
  mmop = OP_MMBINI;
LAB_0010e7c4:
  finishbinexpval(fs,e1,e2,op,iVar3,uVar6,line,mmop,event);
switchD_0010e1e6_default:
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr opr,
                  expdesc *e1, expdesc *e2, int line) {
  luaK_dischargevars(fs, e2);
  if (foldbinop(opr) && constfolding(fs, opr + LUA_OPADD, e1, e2))
    return;  /* done by folding */
  switch (opr) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {  /* e1 .. e2 */
      luaK_exp2nextreg(fs, e2);
      codeconcat(fs, e1, e2, line);
      break;
    }
    case OPR_ADD: case OPR_MUL: {
      codecommutative(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SUB: {
      if (finishbinexpneg(fs, e1, e2, OP_ADDI, line, TM_SUB))
        break; /* coded as (r1 + -I) */
      /* ELSE */
    }  /* FALLTHROUGH */
    case OPR_DIV: case OPR_IDIV: case OPR_MOD: case OPR_POW: {
      codearith(fs, opr, e1, e2, 0, line);
      break;
    }
    case OPR_BAND: case OPR_BOR: case OPR_BXOR: {
      codebitwise(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHL: {
      if (isSCint(e1)) {
        swapexps(e1, e2);
        codebini(fs, OP_SHLI, e1, e2, 1, line, TM_SHL);  /* I << r2 */
      }
      else if (finishbinexpneg(fs, e1, e2, OP_SHRI, line, TM_SHL)) {
        /* coded as (r1 >> -I) */;
      }
      else  /* regular case (two registers) */
       codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHR: {
      if (isSCint(e2))
        codebini(fs, OP_SHRI, e1, e2, 0, line, TM_SHR);  /* r1 >> I */
      else  /* regular case (two registers) */
        codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_NE: {
      codeeq(fs, opr, e1, e2);
      break;
    }
    case OPR_GT: case OPR_GE: {
      /* '(a > b)' <=> '(b < a)';  '(a >= b)' <=> '(b <= a)' */
      swapexps(e1, e2);
      opr = cast(BinOpr, (opr - OPR_GT) + OPR_LT);
    }  /* FALLTHROUGH */
    case OPR_LT: case OPR_LE: {
      codeorder(fs, opr, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}